

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

uint rf_compile_shader(char *shader_str,int type)

{
  char local_448 [8];
  char log [1024];
  int local_40 [2];
  int length;
  int max_len;
  char *local_30;
  undefined8 local_28;
  int local_1c;
  uint local_18;
  int success;
  uint shader;
  int type_local;
  char *shader_str_local;
  
  success = type;
  _shader = shader_str;
  local_18 = (*(rf__ctx->field_0).gfx_ctx.gl.CreateShader)(type);
  (*(rf__ctx->field_0).gfx_ctx.gl.ShaderSource)(local_18,1,(char **)&shader,(int *)0x0);
  local_1c = 0;
  (*(rf__ctx->field_0).gfx_ctx.gl.CompileShader)(local_18);
  (*(rf__ctx->field_0).gfx_ctx.gl.GetShaderiv)(local_18,0x8b81,&local_1c);
  if (local_1c == 1) {
    rf_log_impl(2,0x1b5996,(char *)(ulong)local_18);
  }
  else {
    _length = 
    "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    local_30 = "rf_compile_shader";
    local_28 = 0x97ee;
    rf_log_impl(4,0x1b596d,(char *)(ulong)local_18);
    local_40[1] = 0;
    (*(rf__ctx->field_0).gfx_ctx.gl.GetShaderiv)(local_18,0x8b84,local_40 + 1);
    (*(rf__ctx->field_0).gfx_ctx.gl.GetShaderInfoLog)(local_18,0x400,local_40,local_448);
    rf_log_impl(2,0x1b33d9,local_448);
  }
  return local_18;
}

Assistant:

RF_INTERNAL unsigned int rf_compile_shader(const char* shader_str, int type)
{
    unsigned int shader = rf_gl.CreateShader(type);
    rf_gl.ShaderSource(shader, 1, &shader_str, NULL);

    int success = 0;
    rf_gl.CompileShader(shader);
    rf_gl.GetShaderiv(shader, GL_COMPILE_STATUS, &success);

    if (success != GL_TRUE)
    {
        RF_LOG(RF_LOG_TYPE_WARNING, "[SHDR ID %i] Failed to compile shader...", shader);
        int max_len = 0;
        int length;
        rf_gl.GetShaderiv(shader, GL_INFO_LOG_LENGTH, &max_len);

        //@Note: Buffer may not be big enough for some messages
        char log[1024];

        rf_gl.GetShaderInfoLog(shader, 1024, &length, log);

        RF_LOG(RF_LOG_TYPE_INFO, "%s", log);
    }
    else RF_LOG(RF_LOG_TYPE_INFO, "[SHDR ID %i] rf_shader compiled successfully", shader);

    return shader;
}